

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::L2NormalizeLayerParams::MergePartialFromCodedStream
          (L2NormalizeLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint tag;
  ulong uVar5;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001ce2a4;
      input->buffer_ = pbVar2 + 1;
      uVar5 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001ce2a4:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar5 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar5 = 0x100000000;
      }
      uVar5 = uVar4 | uVar5;
    }
    tag = (uint)uVar5;
    if (((uVar5 & 0x100000000) == 0) || ((char)uVar5 != '\r' || (tag & 0xfffffff8) != 8)) {
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
    }
    else {
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,&this->epsilon_);
    }
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool L2NormalizeLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.L2NormalizeLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float epsilon = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &epsilon_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.L2NormalizeLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.L2NormalizeLayerParams)
  return false;
#undef DO_
}